

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_request_state(Curl_easy *data,_Bool *done)

{
  curl_off_t *pcVar1;
  connectdata *conn;
  smb_request *psVar2;
  char *__s;
  char *__s_00;
  curl_off_t cVar3;
  FILEPROTO *pFVar4;
  undefined8 *puVar5;
  connectdata *pcVar6;
  void *pvVar7;
  unsigned_short uVar8;
  unsigned_short uVar9;
  CURLcode CVar10;
  __pid_t _Var11;
  size_t sVar12;
  size_t sVar13;
  uint uVar14;
  size_t sVar15;
  int iVar16;
  curl_pp_transfer cVar17;
  ulong uVar18;
  CURLcode CVar19;
  uchar cmd;
  long lVar20;
  short sVar21;
  bool bVar22;
  void *msg;
  smb_tree_disconnect msg_1;
  void *local_470;
  undefined1 local_468;
  undefined1 uStack_467;
  undefined1 uStack_466;
  undefined2 uStack_465;
  undefined1 uStack_463;
  undefined1 uStack_462;
  undefined1 uStack_461;
  undefined1 uStack_460;
  undefined2 uStack_45f;
  char acStack_45d [9];
  int iStack_454;
  undefined1 uStack_450;
  undefined2 uStack_44f;
  undefined5 uStack_44d;
  undefined4 uStack_448;
  int iStack_444;
  undefined7 uStack_440;
  undefined1 uStack_439;
  undefined1 uStack_438;
  undefined2 uStack_437;
  char acStack_435 [1029];
  
  conn = data->conn;
  psVar2 = (data->req).p.smb;
  local_470 = (void *)0x0;
  if ((((data->state).field_0x776 & 2) != 0) && ((data->state).infilesize < 0)) {
    Curl_failf(data,"SMB upload needs to know the size up front");
    return CURLE_SEND_ERROR;
  }
  if (psVar2->state == SMB_REQUESTING) {
    __s = (conn->host).name;
    sVar12 = strlen(__s);
    __s_00 = (char *)(conn->proto).rtspc.buf.toobig;
    sVar13 = strlen(__s_00);
    uVar18 = sVar13 + sVar12 + 10;
    CVar10 = CURLE_FILESIZE_EXCEEDED;
    if (uVar18 < 0x401) {
      uStack_466 = 0;
      uStack_465 = 0;
      uStack_463 = 0;
      uStack_462 = 0;
      uStack_45f = 0;
      local_468 = 4;
      uStack_467 = 0xff;
      uStack_461 = 0;
      uStack_460 = 0;
      curl_msnprintf(acStack_45d,uVar18,"\\\\%s\\%s%c%s",__s,__s_00,0,"?????");
      uStack_45f = (undefined2)uVar18;
      CVar10 = smb_send_message(data,'u',&local_468,sVar13 + sVar12 + 0x15);
    }
    if (CVar10 != CURLE_OK) goto LAB_0015665b;
    ((data->req).p.imap)->transfer = PPTRANSFER_INFO;
  }
  CVar10 = smb_send_and_recv(data,&local_470);
  pvVar7 = local_470;
  if ((CVar10 != CURLE_OK) && (CVar10 != CURLE_AGAIN)) {
LAB_0015665b:
    Curl_conncontrol(conn,1);
    return CVar10;
  }
  if (local_470 == (void *)0x0) {
    return CURLE_OK;
  }
  switch(psVar2->state) {
  case SMB_TREE_CONNECT:
    if (*(int *)((long)local_470 + 9) == 0) {
      psVar2->tid = *(unsigned_short *)((long)local_470 + 0x1c);
      cVar17 = PPTRANSFER_NONE;
      (conn->proto).ftpc.pp.sendbuf.toobig = 0;
      pFVar4 = (data->req).p.file;
      sVar12 = strlen(pFVar4->freepath);
      CVar10 = CURLE_FILESIZE_EXCEEDED;
      if (sVar12 + 1 < 0x401) {
        uStack_466 = 0;
        uStack_465 = 0;
        uStack_463 = 0;
        uStack_460 = 0;
        uStack_45f = 0;
        acStack_45d[0] = '\0';
        acStack_45d[1] = '\0';
        acStack_45d[2] = '\0';
        acStack_45d[3] = '\0';
        uStack_440 = 0;
        iStack_454 = 0;
        uStack_450 = 0;
        uStack_44f = 0;
        uStack_44d = 0;
        uStack_439 = 0;
        uStack_438 = 0;
        local_468 = 0x18;
        uStack_467 = 0xff;
        uStack_462 = (undefined1)sVar12;
        uStack_461 = (undefined1)(sVar12 >> 8);
        uVar14 = *(uint *)&(data->state).field_0x774 >> 0x11 & 1;
        acStack_45d[4] = '\0';
        acStack_45d[5] = '\0';
        acStack_45d[6] = '\0';
        acStack_45d[7] = '\0';
        acStack_45d[8] = (char)((uVar14 - 2) * 0x40000000 >> 0x18);
        _uStack_448 = CONCAT44(uVar14 * 4 + 1,7);
        uStack_437 = (undefined2)(sVar12 + 1);
        strcpy(acStack_435,pFVar4->freepath);
        CVar10 = smb_send_message(data,0xa2,&local_468,sVar12 + 0x34);
      }
      goto LAB_00156ca8;
    }
    CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
    if (*(int *)((long)local_470 + 9) == 0x50001) {
      CVar10 = CURLE_REMOTE_ACCESS_DENIED;
    }
    psVar2->result = CVar10;
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    break;
  case SMB_OPEN:
    if ((*(int *)((long)local_470 + 9) == 0) && (99 < (conn->proto).ftpc.pp.sendbuf.toobig)) {
      psVar2->fid = *(unsigned_short *)((long)local_470 + 0x2a);
      (data->req).offset = 0;
      if (((data->state).field_0x776 & 2) != 0) {
        cVar3 = (data->state).infilesize;
        (data->req).size = cVar3;
        Curl_pgrsSetUploadSize(data,cVar3);
        cVar17 = 4;
        (conn->proto).ftpc.pp.sendbuf.toobig = 0;
switchD_001568b9_caseD_1:
        psVar2 = (data->req).p.smb;
        cVar3 = (data->req).offset;
        sVar15 = (data->req).size - (data->req).bytecount;
        puVar5 = (undefined8 *)(data->conn->proto).ftpc.pp.response_time;
        if (0x7ffe < (long)sVar15) {
          sVar15 = 0x7fff;
        }
        puVar5[4] = 0;
        puVar5[5] = 0;
        *(undefined4 *)(puVar5 + 8) = 0;
        puVar5[6] = 0;
        puVar5[7] = 0;
        puVar5[2] = 0;
        puVar5[3] = 0;
        *puVar5 = 0;
        puVar5[1] = 0;
        *(undefined2 *)((long)puVar5 + 0x24) = 0xff0e;
        *(unsigned_short *)((long)puVar5 + 0x29) = psVar2->fid;
        *(int *)((long)puVar5 + 0x2b) = (int)cVar3;
        *(int *)((long)puVar5 + 0x3d) = (int)((ulong)cVar3 >> 0x20);
        sVar21 = (short)sVar15;
        *(short *)((long)puVar5 + 0x39) = sVar21;
        *(undefined2 *)((long)puVar5 + 0x3b) = 0x40;
        *(short *)((long)puVar5 + 0x41) = sVar21 + 1;
        pcVar6 = data->conn;
        psVar2 = (data->req).p.smb;
        *puVar5 = 0;
        puVar5[1] = 0;
        *(undefined4 *)(puVar5 + 4) = 0;
        puVar5[2] = 0;
        puVar5[3] = 0;
        *(ushort *)((long)puVar5 + 2) = (sVar21 + 0x40U) * 0x100 | (ushort)(sVar21 + 0x40U) >> 8;
        *(undefined4 *)((long)puVar5 + 4) = 0x424d53ff;
        *(undefined1 *)(puVar5 + 1) = 0x2f;
        *(undefined1 *)((long)puVar5 + 0xd) = 0x18;
        *(undefined2 *)((long)puVar5 + 0xe) = 0x41;
        *(unsigned_short *)(puVar5 + 4) = (pcVar6->proto).smbc.uid;
        *(unsigned_short *)((long)puVar5 + 0x1c) = psVar2->tid;
        _Var11 = getpid();
        *(short *)(puVar5 + 2) = (short)((uint)_Var11 >> 0x10);
        *(short *)((long)puVar5 + 0x1e) = (short)_Var11;
        CVar10 = smb_send(data,0x44,sVar15);
        goto LAB_00156ca8;
      }
      lVar20 = *(long *)((long)local_470 + 0x5c);
      (data->req).size = lVar20;
      if (lVar20 < 0) {
        psVar2->result = CURLE_WEIRD_SERVER_REPLY;
        cVar17 = 5;
        (conn->proto).ftpc.pp.sendbuf.toobig = 0;
        goto switchD_001568b9_caseD_0;
      }
      Curl_pgrsSetDownloadSize(data,lVar20);
      iVar16 = 3;
      if (((data->set).field_0x8ca & 0x80) == 0) goto LAB_001566ab;
      (data->info).filetime = (*(long *)((long)pvVar7 + 0x48) + -0x19db1ded53e8000) / 10000000;
      cVar17 = PPTRANSFER_NONE|PPTRANSFER_INFO;
      (conn->proto).ftpc.pp.sendbuf.toobig = 0;
switchD_00156a1d_caseD_0:
      cVar3 = (data->req).offset;
      uStack_466 = 0;
      uStack_465 = 0;
      acStack_45d[4] = '\0';
      acStack_45d[5] = '\0';
      acStack_45d[6] = '\0';
      acStack_45d[7] = '\0';
      acStack_45d[8] = 0;
      uStack_44f = 0;
      local_468 = 0xc;
      uStack_467 = 0xff;
      uVar9 = ((data->req).p.smb)->fid;
      uStack_463 = (undefined1)uVar9;
      uStack_462 = (undefined1)(uVar9 >> 8);
      uStack_461 = (undefined1)cVar3;
      uStack_460 = (undefined1)((ulong)cVar3 >> 8);
      uStack_45f = (undefined2)((ulong)cVar3 >> 0x10);
      iStack_454 = (int)((ulong)cVar3 >> 0x20) << 8;
      uStack_450 = (undefined1)((ulong)cVar3 >> 0x38);
      acStack_45d[0] = '\0';
      acStack_45d[1] = -0x80;
      acStack_45d[2] = '\0';
      acStack_45d[3] = -0x80;
      sVar15 = 0x1b;
      cmd = '.';
    }
    else {
      CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
      if (*(int *)((long)local_470 + 9) == 0x50001) {
        CVar10 = CURLE_REMOTE_ACCESS_DENIED;
      }
      psVar2->result = CVar10;
      cVar17 = 6;
      (conn->proto).ftpc.pp.sendbuf.toobig = 0;
      uStack_466 = 0;
      local_468 = 0;
      uStack_467 = 0;
      sVar15 = 3;
      cmd = 'q';
    }
    goto LAB_00156ca0;
  case SMB_DOWNLOAD:
    if ((*(int *)((long)local_470 + 9) == 0) && (0x31 < (conn->proto).ftpc.pp.sendbuf.toobig)) {
      uVar9 = Curl_read16_le((uchar *)((long)local_470 + 0x2f));
      uVar8 = Curl_read16_le((uchar *)((long)pvVar7 + 0x31));
      uVar18 = (ulong)uVar9;
      if (uVar9 != 0) {
        if ((conn->proto).ftpc.pp.sendbuf.toobig < uVar8 + uVar18 + 4) {
          Curl_failf(data,"Invalid input packet");
          CVar10 = CURLE_RECV_ERROR;
        }
        else {
          CVar10 = Curl_client_write(data,1,(char *)((long)pvVar7 + (ulong)uVar8 + 4),uVar18);
        }
        if (CVar10 != CURLE_OK) {
          psVar2->result = CVar10;
          cVar17 = 5;
          (conn->proto).ftpc.pp.sendbuf.toobig = 0;
          goto switchD_001568b9_caseD_0;
        }
      }
      pcVar1 = &(data->req).offset;
      *pcVar1 = *pcVar1 + uVar18;
      bVar22 = -1 < (short)uVar9;
      cVar17 = bVar22 + 3 + (uint)bVar22;
      (conn->proto).ftpc.pp.sendbuf.toobig = 0;
      switch(bVar22) {
      case false:
        goto switchD_00156a1d_caseD_0;
      }
    }
    else {
      psVar2->result = CURLE_RECV_ERROR;
      cVar17 = 5;
      (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    }
    goto switchD_001568b9_caseD_0;
  case SMB_UPLOAD:
    if ((*(int *)((long)local_470 + 9) == 0) && (0x29 < (conn->proto).ftpc.pp.sendbuf.toobig)) {
      uVar9 = Curl_read16_le((uchar *)((long)local_470 + 0x29));
      lVar20 = (data->req).bytecount + (ulong)uVar9;
      (data->req).bytecount = lVar20;
      pcVar1 = &(data->req).offset;
      *pcVar1 = *pcVar1 + (ulong)uVar9;
      Curl_pgrsSetUploadCounter(data,lVar20);
      bVar22 = (data->req).bytecount < (data->req).size;
      cVar17 = bVar22 ^ 5;
      (conn->proto).ftpc.pp.sendbuf.toobig = 0;
      switch(bVar22) {
      case true:
        goto switchD_001568b9_caseD_1;
      }
    }
    else {
      psVar2->result = CURLE_UPLOAD_FAILED;
      cVar17 = 5;
      (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    }
switchD_001568b9_caseD_0:
    uStack_465 = 0;
    uStack_463 = 0;
    uStack_462 = 0;
    uStack_461 = 0;
    uStack_460 = 0;
    local_468 = 3;
    uVar9 = ((data->req).p.smb)->fid;
    uStack_467 = (undefined1)uVar9;
    uStack_466 = (undefined1)(uVar9 >> 8);
    sVar15 = 9;
    cmd = '\x04';
LAB_00156ca0:
    CVar10 = smb_send_message(data,cmd,&local_468,sVar15);
    goto LAB_00156ca8;
  case SMB_CLOSE:
    iVar16 = 6;
LAB_001566ab:
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    CVar10 = (*(code *)((long)&DAT_0017d764 + (long)(int)(&DAT_0017d764)[iVar16 - 2]))();
    return CVar10;
  case SMB_TREE_DISCONNECT:
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    break;
  default:
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    return CURLE_OK;
  }
  cVar17 = 7;
  CVar10 = psVar2->result;
  *done = true;
LAB_00156ca8:
  CVar19 = CURLE_OK;
  if (CVar10 == CURLE_OK) {
    ((data->req).p.imap)->transfer = cVar17;
  }
  else {
    Curl_conncontrol(conn,1);
    CVar19 = CVar10;
  }
  return CVar19;
}

Assistant:

static CURLcode smb_request_state(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_request *req = data->req.p.smb;
  struct smb_header *h;
  struct smb_conn *smbc = &conn->proto.smbc;
  enum smb_req_state next_state = SMB_DONE;
  unsigned short len;
  unsigned short off;
  CURLcode result;
  void *msg = NULL;
  const struct smb_nt_create_response *smb_m;

  if(data->state.upload && (data->state.infilesize < 0)) {
    failf(data, "SMB upload needs to know the size up front");
    return CURLE_SEND_ERROR;
  }

  /* Start the request */
  if(req->state == SMB_REQUESTING) {
    result = smb_send_tree_connect(data);
    if(result) {
      connclose(conn, "SMB: failed to send tree connect message");
      return result;
    }

    request_state(data, SMB_TREE_CONNECT);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(data, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(req->state) {
  case SMB_TREE_CONNECT:
    if(h->status) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      break;
    }
    req->tid = smb_swap16(h->tid);
    next_state = SMB_OPEN;
    break;

  case SMB_OPEN:
    if(h->status || smbc->got < sizeof(struct smb_nt_create_response)) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      next_state = SMB_TREE_DISCONNECT;
      break;
    }
    smb_m = (const struct smb_nt_create_response*) msg;
    req->fid = smb_swap16(smb_m->fid);
    data->req.offset = 0;
    if(data->state.upload) {
      data->req.size = data->state.infilesize;
      Curl_pgrsSetUploadSize(data, data->req.size);
      next_state = SMB_UPLOAD;
    }
    else {
      data->req.size = smb_swap64(smb_m->end_of_file);
      if(data->req.size < 0) {
        req->result = CURLE_WEIRD_SERVER_REPLY;
        next_state = SMB_CLOSE;
      }
      else {
        Curl_pgrsSetDownloadSize(data, data->req.size);
        if(data->set.get_filetime)
          get_posix_time(&data->info.filetime, smb_m->last_change_time);
        next_state = SMB_DOWNLOAD;
      }
    }
    break;

  case SMB_DOWNLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 14) {
      req->result = CURLE_RECV_ERROR;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 11);
    off = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 13);
    if(len > 0) {
      if(off + sizeof(unsigned int) + len > smbc->got) {
        failf(data, "Invalid input packet");
        result = CURLE_RECV_ERROR;
      }
      else
        result = Curl_client_write(data, CLIENTWRITE_BODY,
                                   (char *)msg + off + sizeof(unsigned int),
                                   len);
      if(result) {
        req->result = result;
        next_state = SMB_CLOSE;
        break;
      }
    }
    data->req.offset += len;
    next_state = (len < MAX_PAYLOAD_SIZE) ? SMB_CLOSE : SMB_DOWNLOAD;
    break;

  case SMB_UPLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 6) {
      req->result = CURLE_UPLOAD_FAILED;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 5);
    data->req.bytecount += len;
    data->req.offset += len;
    Curl_pgrsSetUploadCounter(data, data->req.bytecount);
    if(data->req.bytecount >= data->req.size)
      next_state = SMB_CLOSE;
    else
      next_state = SMB_UPLOAD;
    break;

  case SMB_CLOSE:
    /* We do not care if the close failed, proceed to tree disconnect anyway */
    next_state = SMB_TREE_DISCONNECT;
    break;

  case SMB_TREE_DISCONNECT:
    next_state = SMB_DONE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  switch(next_state) {
  case SMB_OPEN:
    result = smb_send_open(data);
    break;

  case SMB_DOWNLOAD:
    result = smb_send_read(data);
    break;

  case SMB_UPLOAD:
    result = smb_send_write(data);
    break;

  case SMB_CLOSE:
    result = smb_send_close(data);
    break;

  case SMB_TREE_DISCONNECT:
    result = smb_send_tree_disconnect(data);
    break;

  case SMB_DONE:
    result = req->result;
    *done = TRUE;
    break;

  default:
    break;
  }

  if(result) {
    connclose(conn, "SMB: failed to send message");
    return result;
  }

  request_state(data, next_state);

  return CURLE_OK;
}